

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_7::Validator::OnMemoryInitExpr(Validator *this,MemoryInitExpr *expr)

{
  Location *loc;
  Index local_1c [2];
  Index index;
  
  loc = &(expr->super_ExprMixin<(wabt::ExprType)27>).super_Expr.loc;
  this->expr_loc_ = loc;
  CheckHasMemory(this,loc,(Opcode)0xc5);
  CheckVar(this,(Index)((ulong)((long)(this->current_module_->data_segments).
                                      super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->current_module_->data_segments).
                                     super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3),&expr->var,
           "data_segment",local_1c);
  if ((expr->var).type_ == Index) {
    TypeChecker::OnMemoryInit(&this->typechecker_,(expr->var).field_2.index_);
    return (Result)Ok;
  }
  __assert_fail("is_index()",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/ir.h"
                ,0x36,"Index wabt::Var::index() const");
}

Assistant:

Result Validator::OnMemoryInitExpr(MemoryInitExpr* expr) {
  expr_loc_ = &expr->loc;
  CheckHasMemory(&expr->loc, Opcode::MemoryInit);
  CheckDataSegmentVar(&expr->var);
  typechecker_.OnMemoryInit(expr->var.index());
  return Result::Ok;
}